

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O0

int latency_macro_test(void)

{
  initializer_list<unsigned_long> __l;
  initializer_list<std::function<void_()>_> __l_00;
  ulong uVar1;
  bool bVar2;
  LatencyCollector *pLVar3;
  size_type sVar4;
  reference pvVar5;
  pair<const_double,_unsigned_long> *entry;
  iterator __end2;
  iterator __begin2;
  map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  *__range2;
  map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  hist;
  LatencyItem chk;
  string *item_name;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  LatencyCollectorDumpOptions opt;
  Msg msg_stream;
  LatencyDumpDefaultImpl default_dump;
  LatencyCollectWrapper LCW__block_latency__;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> funcs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> n_calls;
  size_t j;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  LatencyItem *in_stack_fffffffffffffb00;
  LatencyCollector *pLVar6;
  _func_void *in_stack_fffffffffffffb08;
  function<void_()> *in_stack_fffffffffffffb10;
  LatencyCollector *in_stack_fffffffffffffb18;
  LatencyCollectWrapper *in_stack_fffffffffffffb20;
  allocator_type *in_stack_fffffffffffffb28;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
  *in_stack_fffffffffffffb30;
  iterator in_stack_fffffffffffffb38;
  size_type in_stack_fffffffffffffb40;
  LatencyCollector *in_stack_fffffffffffffb50;
  LatencyCollectorDumpOptions *in_stack_fffffffffffffb58;
  Msg *in_stack_fffffffffffffb60;
  LatencyCollector *in_stack_fffffffffffffb68;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_448;
  string *this;
  undefined1 ***local_398;
  LatencyCollectorDumpOptions local_370;
  string local_368 [32];
  reference local_348;
  _Self local_340;
  _Self local_338;
  undefined1 *local_330;
  undefined1 local_328 [48];
  LatencyCollector *local_2f8;
  uint64_t local_2f0;
  const_iterator local_298;
  const_iterator local_290;
  const_iterator local_288;
  undefined1 local_27b;
  allocator local_27a;
  undefined1 local_279 [9];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270 [2];
  string local_250 [32];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_220;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [36];
  LatencyCollectorDumpOptions local_154;
  Msg local_149 [16];
  allocator local_139;
  string local_138 [64];
  undefined1 **local_f8 [12];
  undefined8 **local_98;
  undefined8 local_90;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 *local_48;
  undefined8 local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  ulong local_20;
  ulong local_18;
  
  pLVar3 = (LatencyCollector *)operator_new(0x58);
  LatencyCollector::LatencyCollector(in_stack_fffffffffffffb50);
  local_68 = 0x17;
  uStack_60 = 0x13;
  local_58 = 0xd;
  local_48 = &local_68;
  local_40 = 3;
  global_lat = pLVar3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1042e1);
  __l._M_len = in_stack_fffffffffffffb40;
  __l._M_array = (iterator)in_stack_fffffffffffffb38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb30,__l,
             (allocator_type *)in_stack_fffffffffffffb28);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x104315);
  std::function<void()>::function<void(&)(),void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::function<void()>::function<void(&)(),void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::function<void()>::function<void(&)(),void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  local_90 = 3;
  local_98 = local_f8;
  std::allocator<std::function<void_()>_>::allocator((allocator<std::function<void_()>_> *)0x10438a)
  ;
  __l_00._M_len = in_stack_fffffffffffffb40;
  __l_00._M_array = in_stack_fffffffffffffb38;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (in_stack_fffffffffffffb30,__l_00,in_stack_fffffffffffffb28);
  std::allocator<std::function<void_()>_>::~allocator
            ((allocator<std::function<void_()>_> *)0x1043be);
  local_398 = (undefined1 ***)&local_98;
  do {
    local_398 = local_398 + -4;
    std::function<void_()>::~function((function<void_()> *)0x1043f3);
  } while (local_398 != local_f8);
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_38);
    if (sVar4 <= uVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"outer for-loop",&local_139);
    LatencyCollectWrapper::LatencyCollectWrapper
              (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
               (string *)in_stack_fffffffffffffb10);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    local_20 = 0;
    while( true ) {
      uVar1 = local_20;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_38,local_18);
      if (*pvVar5 <= uVar1) break;
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::operator[]
                (&local_88,local_18);
      std::function<void_()>::operator()((function<void_()> *)in_stack_fffffffffffffb00);
      local_20 = local_20 + 1;
    }
    LatencyCollectWrapper::~LatencyCollectWrapper
              ((LatencyCollectWrapper *)in_stack_fffffffffffffb50);
    local_18 = local_18 + 1;
  }
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_38);
    if (sVar4 <= uVar1) break;
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::operator[]
              (&local_88,local_18);
    std::function<void_()>::operator()((function<void_()> *)in_stack_fffffffffffffb00);
    local_18 = local_18 + 1;
  }
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_38,2);
    if (*pvVar5 + 1 <= uVar1) break;
    test_function_4ms();
    local_18 = local_18 + 1;
  }
  LatencyDumpDefaultImpl::LatencyDumpDefaultImpl
            ((LatencyDumpDefaultImpl *)in_stack_fffffffffffffb00);
  TestSuite::Msg::Msg(local_149);
  LatencyCollectorDumpOptions::LatencyCollectorDumpOptions(&local_154);
  local_154.view_type = TREE;
  local_154.sort_by = TOTAL_TIME;
  LatencyCollector::dump_abi_cxx11_
            (in_stack_fffffffffffffb68,(LatencyDump *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_178);
  local_154.sort_by = AVG_LATENCY;
  LatencyCollector::dump_abi_cxx11_
            (in_stack_fffffffffffffb68,(LatencyDump *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_198);
  local_154.sort_by = NUM_CALLS;
  LatencyCollector::dump_abi_cxx11_
            (in_stack_fffffffffffffb68,(LatencyDump *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_1b8);
  local_154.view_type = FLAT;
  local_154.sort_by = TOTAL_TIME;
  LatencyCollector::dump_abi_cxx11_
            (in_stack_fffffffffffffb68,(LatencyDump *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_1d8);
  local_154.sort_by = AVG_LATENCY;
  LatencyCollector::dump_abi_cxx11_
            (in_stack_fffffffffffffb68,(LatencyDump *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_1f8);
  local_154.sort_by = NUM_CALLS;
  LatencyCollector::dump_abi_cxx11_
            (in_stack_fffffffffffffb68,(LatencyDump *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_218);
  local_27b = 1;
  this = (string *)(local_279 + 9);
  pLVar3 = (LatencyCollector *)local_279;
  local_279._1_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,"test_function_3ms",(allocator *)pLVar3);
  local_279._1_8_ = local_250;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"inner_function",&local_27a);
  local_27b = 0;
  local_230._M_array = (iterator)(local_279 + 9);
  local_230._M_len = 2;
  std::allocator<char>::~allocator((allocator<char> *)&local_27a);
  std::allocator<char>::~allocator((allocator<char> *)local_279);
  local_220 = &local_230;
  local_288 = std::
              initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::begin(local_220);
  local_290 = std::
              initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::end((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffb00);
  for (; local_288 != local_290; local_288 = local_288 + 0x20) {
    local_298 = local_288;
    LatencyCollector::getAggrItem(pLVar3,(string *)this);
    TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    TestSuite::Msg::operator<<
              ((Msg *)in_stack_fffffffffffffb00,(char (*) [3])in_stack_fffffffffffffaf8);
    TestSuite::Msg::operator<<
              ((Msg *)in_stack_fffffffffffffb00,(char (*) [7])in_stack_fffffffffffffaf8);
    local_2f0 = LatencyItem::getTotalTime((LatencyItem *)0x104dee);
    TestSuite::Msg::operator<<
              ((Msg *)in_stack_fffffffffffffb00,(unsigned_long *)in_stack_fffffffffffffaf8);
    TestSuite::Msg::operator<<
              ((Msg *)in_stack_fffffffffffffb00,(char (*) [6])in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffb68 =
         (LatencyCollector *)LatencyItem::getNumCalls((LatencyItem *)0x104e4f);
    local_2f8 = in_stack_fffffffffffffb68;
    in_stack_fffffffffffffb60 =
         TestSuite::Msg::operator<<
                   ((Msg *)in_stack_fffffffffffffb00,(unsigned_long *)in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffb58 =
         (LatencyCollectorDumpOptions *)
         TestSuite::Msg::operator<<
                   ((Msg *)in_stack_fffffffffffffb00,(char (*) [7])in_stack_fffffffffffffaf8);
    TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8)
    ;
    LatencyItem::dumpHistogram((LatencyItem *)pLVar3);
    local_330 = local_328;
    local_338._M_node =
         (_Base_ptr)
         std::
         map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
         ::begin((map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffaf8);
    local_340._M_node =
         (_Base_ptr)
         std::
         map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
         ::end((map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                *)in_stack_fffffffffffffaf8);
    while( true ) {
      bVar2 = std::operator!=(&local_338,&local_340);
      if (!bVar2) break;
      local_348 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator*
                            ((_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> *)0x104f23)
      ;
      TestSuite::Msg::operator<<
                ((Msg *)in_stack_fffffffffffffb00,(char (*) [11])in_stack_fffffffffffffaf8);
      TestSuite::Msg::operator<<
                ((Msg *)in_stack_fffffffffffffb00,(double *)in_stack_fffffffffffffaf8);
      TestSuite::Msg::operator<<
                ((Msg *)in_stack_fffffffffffffb00,(char (*) [3])in_stack_fffffffffffffaf8);
      TestSuite::Msg::operator<<
                ((Msg *)in_stack_fffffffffffffb00,(unsigned_long *)in_stack_fffffffffffffaf8);
      TestSuite::Msg::operator<<
                ((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8);
      std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> *)
                 in_stack_fffffffffffffb00);
    }
    std::
    map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
    ::~map((map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
            *)0x10501a);
    LatencyItem::~LatencyItem(in_stack_fffffffffffffb00);
  }
  local_448 = &local_230;
  do {
    local_448 = local_448 + -2;
    std::__cxx11::string::~string((string *)local_448);
  } while (local_448 !=
           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(local_279 + 9));
  pLVar3 = global_lat;
  LatencyCollectorDumpOptions::LatencyCollectorDumpOptions(&local_370);
  LatencyCollector::dump_abi_cxx11_
            (in_stack_fffffffffffffb68,(LatencyDump *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffb00,(EndlFunc)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_368);
  if (global_lat != (LatencyCollector *)0x0) {
    pLVar6 = global_lat;
    LatencyCollector::~LatencyCollector(global_lat);
    operator_delete(pLVar6);
  }
  global_lat = (LatencyCollector *)0x0;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)pLVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pLVar3);
  return 0;
}

Assistant:

int latency_macro_test() {
    global_lat = new LatencyCollector();

    size_t i, j;
    std::vector<size_t> n_calls = {23, 19, 13};
    std::vector<std::function<void()> >
            funcs = {test_function_1ms,
                     test_function_2ms,
                     test_function_3ms};

    for (i=0; i<n_calls.size(); ++i) {
        collectBlockLatency(global_lat, "outer for-loop");
        for (j=0; j<n_calls[i]; ++j) {
            funcs[i]();
        }
    }

    for (i=0; i<n_calls.size(); ++i) {
        funcs[i]();
    }

    for (i=0; i<n_calls[2]+1; ++i) {
        test_function_4ms();
    }

    LatencyDumpDefaultImpl default_dump;
    TestSuite::Msg msg_stream;

    LatencyCollectorDumpOptions opt;
    opt.view_type = LatencyCollectorDumpOptions::TREE;
    opt.sort_by = LatencyCollectorDumpOptions::TOTAL_TIME;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::AVG_LATENCY;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::NUM_CALLS;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.view_type = LatencyCollectorDumpOptions::FLAT;
    opt.sort_by = LatencyCollectorDumpOptions::TOTAL_TIME;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::AVG_LATENCY;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::NUM_CALLS;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    for ( const std::string& item_name: { std::string("test_function_3ms"),
                                          std::string("inner_function") } ) {
        LatencyItem chk = global_lat->getAggrItem(item_name);
        msg_stream << item_name << ": "
                   << "total " << chk.getTotalTime() << " us, "
                   << chk.getNumCalls() << " calls" << std::endl;
        std::map<double, uint64_t> hist = chk.dumpHistogram();
        for (auto& entry: hist) {
            msg_stream << "less than " << entry.first << ": "
                       << entry.second << std::endl;
        }
    }

    msg_stream << global_lat->dump(nullptr) << std::endl;

    delete global_lat;
    global_lat = nullptr;

    return 0;
}